

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall
ImFontAtlas::GetMouseCursorTexData
          (ImFontAtlas *this,ImGuiMouseCursor cursor_type,ImVec2 *out_offset,ImVec2 *out_size,
          ImVec2 *out_uv_border,ImVec2 *out_uv_fill)

{
  undefined2 uVar1;
  undefined2 uVar4;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  ImVec2 IVar7;
  float fVar8;
  ImFontAtlasCustomRect *pIVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  if (((uint)cursor_type < 9) && ((this->Flags & 2) == 0)) {
    IVar2 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][0];
    IVar7 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][2];
    IVar3 = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    pIVar9 = (this->CustomRects).Data + this->CustomRectIds[0];
    uVar1 = pIVar9->X;
    uVar4 = pIVar9->Y;
    uVar5 = pIVar9->GlyphAdvanceX;
    auVar6._4_4_ = uVar5;
    auVar6._2_2_ = uVar4;
    auVar6._0_2_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6 = vpmovzxwd_avx(auVar6);
    *out_size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[(uint)cursor_type][1];
    *out_offset = IVar7;
    auVar6 = vcvtdq2ps_avx(auVar6);
    auVar10._0_4_ = IVar2.x + auVar6._0_4_;
    auVar10._4_4_ = IVar2.y + auVar6._4_4_;
    auVar10._8_4_ = auVar6._8_4_ + 0.0;
    auVar10._12_4_ = auVar6._12_4_ + 0.0;
    auVar13._0_4_ = auVar10._0_4_ * (this->TexUvScale).x;
    auVar13._4_4_ = auVar10._4_4_ * (this->TexUvScale).y;
    auVar13._8_4_ = auVar10._8_4_ * 0.0;
    auVar13._12_4_ = auVar10._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar13);
    *out_uv_border = IVar2;
    fVar8 = IVar3.x;
    auVar14._0_4_ = auVar10._0_4_ + fVar8;
    auVar14._4_4_ = auVar10._4_4_ + IVar3.y;
    auVar14._8_4_ = auVar10._8_4_ + 0.0;
    auVar14._12_4_ = auVar10._12_4_ + 0.0;
    auVar15._0_4_ = auVar14._0_4_ * (this->TexUvScale).x;
    auVar15._4_4_ = auVar14._4_4_ * (this->TexUvScale).y;
    auVar15._8_4_ = auVar14._8_4_ * 0.0;
    auVar15._12_4_ = auVar14._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar15);
    out_uv_border[1] = IVar2;
    auVar6 = vblendps_avx(ZEXT416((uint)(auVar10._0_4_ + 109.0)),auVar10,2);
    auVar11._0_4_ = auVar6._0_4_ * (this->TexUvScale).x;
    auVar11._4_4_ = auVar6._4_4_ * (this->TexUvScale).y;
    auVar11._8_4_ = auVar6._8_4_ * 0.0;
    auVar11._12_4_ = auVar6._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar11);
    *out_uv_fill = IVar2;
    auVar6 = vblendps_avx(ZEXT416((uint)(auVar10._0_4_ + 109.0 + fVar8)),auVar14,2);
    auVar12._0_4_ = auVar6._0_4_ * (this->TexUvScale).x;
    auVar12._4_4_ = auVar6._4_4_ * (this->TexUvScale).y;
    auVar12._8_4_ = auVar6._8_4_ * 0.0;
    auVar12._12_4_ = auVar6._12_4_ * 0.0;
    IVar2 = (ImVec2)vmovlps_avx(auVar12);
    out_uv_fill[1] = IVar2;
    return true;
  }
  return false;
}

Assistant:

bool ImFontAtlas::GetMouseCursorTexData(ImGuiMouseCursor cursor_type, ImVec2* out_offset, ImVec2* out_size, ImVec2 out_uv_border[2], ImVec2 out_uv_fill[2])
{
    if (cursor_type <= ImGuiMouseCursor_None || cursor_type >= ImGuiMouseCursor_COUNT)
        return false;
    if (Flags & ImFontAtlasFlags_NoMouseCursors)
        return false;

    IM_ASSERT(CustomRectIds[0] != -1);
    ImFontAtlasCustomRect& r = CustomRects[CustomRectIds[0]];
    IM_ASSERT(r.ID == FONT_ATLAS_DEFAULT_TEX_DATA_ID);
    ImVec2 pos = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][0] + ImVec2((float)r.X, (float)r.Y);
    ImVec2 size = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][1];
    *out_size = size;
    *out_offset = FONT_ATLAS_DEFAULT_TEX_CURSOR_DATA[cursor_type][2];
    out_uv_border[0] = (pos) * TexUvScale;
    out_uv_border[1] = (pos + size) * TexUvScale;
    pos.x += FONT_ATLAS_DEFAULT_TEX_DATA_W_HALF + 1;
    out_uv_fill[0] = (pos) * TexUvScale;
    out_uv_fill[1] = (pos + size) * TexUvScale;
    return true;
}